

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlSetTexture(uint id)

{
  uint uVar1;
  rlDrawCall *prVar2;
  _Bool _Var3;
  long lVar4;
  uint uVar5;
  
  if (id == 0) {
    if ((RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].elementCount * 4 <=
        RLGL.State.vertexCounter) {
      rlDrawRenderBatch(RLGL.currentBatch);
      return;
    }
  }
  else {
    prVar2 = (RLGL.currentBatch)->draws;
    lVar4 = (long)(RLGL.currentBatch)->drawCounter;
    if (prVar2[lVar4 + -1].textureId != id) {
      uVar1 = prVar2[lVar4 + -1].vertexCount;
      if (0 < (int)uVar1) {
        if (prVar2[lVar4 + -1].mode == 4) {
          uVar5 = 1;
          if (3 < (int)uVar1) {
            uVar5 = 4 - (uVar1 & 3);
          }
        }
        else {
          uVar5 = 0;
          if ((prVar2[lVar4 + -1].mode == 1) && (uVar5 = uVar1 & 3, (int)uVar1 < 4)) {
            uVar5 = uVar1;
          }
        }
        prVar2[lVar4 + -1].vertexAlignment = uVar5;
        _Var3 = rlCheckRenderBatchLimit
                          ((RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].
                           vertexAlignment);
        if (!_Var3) {
          RLGL.State.vertexCounter =
               RLGL.State.vertexCounter +
               (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].
               vertexAlignment;
          (RLGL.currentBatch)->drawCounter = (RLGL.currentBatch)->drawCounter + 1;
        }
      }
      if (0xff < (RLGL.currentBatch)->drawCounter) {
        rlDrawRenderBatch(RLGL.currentBatch);
      }
      (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].textureId = id;
      (RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawCounter + -1].vertexCount = 0;
    }
  }
  return;
}

Assistant:

void rlSetTexture(unsigned int id)
{
    if (id == 0)
    {
#if defined(GRAPHICS_API_OPENGL_11)
        rlDisableTexture();
#else
        // NOTE: If quads batch limit is reached, we force a draw call and next batch starts
        if (RLGL.State.vertexCounter >=
            RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].elementCount*4)
        {
            rlDrawRenderBatch(RLGL.currentBatch);
        }
#endif
    }
    else
    {
#if defined(GRAPHICS_API_OPENGL_11)
        rlEnableTexture(id);
#else
        if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].textureId != id)
        {
            if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount > 0)
            {
                // Make sure current RLGL.currentBatch->draws[i].vertexCount is aligned a multiple of 4,
                // that way, following QUADS drawing will keep aligned with index processing
                // It implies adding some extra alignment vertex at the end of the draw,
                // those vertex are not processed but they are considered as an additional offset
                // for the next set of vertex to be drawn
                if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode == RL_LINES) RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount < 4)? RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount : RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount%4);
                else if (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].mode == RL_TRIANGLES) RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment = ((RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount < 4)? 1 : (4 - (RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount%4)));
                else RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment = 0;

                if (!rlCheckRenderBatchLimit(RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment))
                {
                    RLGL.State.vertexCounter += RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexAlignment;

                    RLGL.currentBatch->drawCounter++;
                }
            }

            if (RLGL.currentBatch->drawCounter >= RL_DEFAULT_BATCH_DRAWCALLS) rlDrawRenderBatch(RLGL.currentBatch);

            RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].textureId = id;
            RLGL.currentBatch->draws[RLGL.currentBatch->drawCounter - 1].vertexCount = 0;
        }
#endif
    }
}